

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_psetstr(Table *t,TString *key,TValue *val)

{
  int iVar1;
  TValue *slot;
  
  if (-1 < key->shrlen) {
    iVar1 = luaH_psetshortstr(t,key,val);
    return iVar1;
  }
  slot = Hgetlongstr(t,key);
  iVar1 = finishnodeset(t,slot,val);
  return iVar1;
}

Assistant:

int luaH_psetstr (Table *t, TString *key, TValue *val) {
  if (strisshr(key))
    return luaH_psetshortstr(t, key, val);
  else
    return finishnodeset(t, Hgetlongstr(t, key), val);
}